

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

int __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
removeRandomGarbage(GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this,Random *rnd)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  
  pSVar1 = (this->m_garbageObjects).
           super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_garbageObjects).
           super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 == pSVar2) {
    iVar4 = -1;
  }
  else {
    iVar3 = de::Random::getInt(rnd,0,(int)((ulong)((long)pSVar2 - (long)pSVar1) >> 4) + -1);
    pSVar1 = (this->m_garbageObjects).
             super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (pSVar1[iVar3].m_ptr)->m_dataSizeApprox;
    std::
    vector<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
    ::erase(&this->m_garbageObjects,pSVar1 + iVar3);
  }
  return iVar4;
}

Assistant:

static int generateRandomPositionAttribData (vector<deUint8>& attrDataBuf, int& dataSizeBytesDst, const VarSpec& attrSpec, const int numVertices, Random& rnd)
{
	DE_ASSERT(glu::isDataTypeFloatOrVec(attrSpec.type));

	const int numComponents = glu::getDataTypeScalarSize(attrSpec.type);
	DE_ASSERT(numComponents >= 2);
	const int offsetInBuf = generateRandomAttribData(attrDataBuf, dataSizeBytesDst, attrSpec, numVertices, rnd);

	if (numComponents > 2)
	{
		float* const data = (float*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			data[vtxNdx*numComponents + 2] = -1.0f;

		for (int triNdx = 0; triNdx < numVertices-2; triNdx++)
		{
			float* const	vtxAComps	= &data[(triNdx+0)*numComponents];
			float* const	vtxBComps	= &data[(triNdx+1)*numComponents];
			float* const	vtxCComps	= &data[(triNdx+2)*numComponents];

			const float		triArea		= triangleArea(Vec2(vtxAComps[0], vtxAComps[1]),
													   Vec2(vtxBComps[0], vtxBComps[1]),
													   Vec2(vtxCComps[0], vtxCComps[1]));
			const float		t			= triArea / (triArea + 1.0f);
			const float		z			= (1.0f-t)*attrSpec.minValue.f[2] + t*attrSpec.maxValue.f[2];

			vtxAComps[2] = de::max(vtxAComps[2], z);
			vtxBComps[2] = de::max(vtxBComps[2], z);
			vtxCComps[2] = de::max(vtxCComps[2], z);
		}
	}

	return offsetInBuf;
}